

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

void __thiscall
pbrt::LightPathIntegrator::LightPathIntegrator
          (LightPathIntegrator *this,int maxDepth,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights)

{
  unique_ptr<pbrt::PowerLightSampler,_std::default_delete<pbrt::PowerLightSampler>_> *this_00;
  pointer pLVar1;
  _Head_base<0UL,_pbrt::PowerLightSampler_*,_false> __ptr_00;
  Allocator alloc;
  _Head_base<0UL,_pbrt::PowerLightSampler_*,_false> this_01;
  pointer __p;
  pointer *__ptr;
  span<const_pbrt::LightHandle> lights_00;
  PowerLightSampler *local_68;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_60;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_48;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_40;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_38;
  
  local_38.bits =
       (camera->
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       ).bits;
  local_40.bits =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_48.bits =
       (aggregate->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector(&local_60,lights);
  ImageTileIntegrator::ImageTileIntegrator
            (&this->super_ImageTileIntegrator,(CameraHandle *)&local_38,(SamplerHandle *)&local_40,
             (PrimitiveHandle *)&local_48,&local_60);
  if (local_60.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_ImageTileIntegrator).super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__LightPathIntegrator_02dadc50;
  this->maxDepth = maxDepth;
  this_00 = &this->lightSampler;
  (this->lightSampler)._M_t.
  super___uniq_ptr_impl<pbrt::PowerLightSampler,_std::default_delete<pbrt::PowerLightSampler>_>._M_t
  .super__Tuple_impl<0UL,_pbrt::PowerLightSampler_*,_std::default_delete<pbrt::PowerLightSampler>_>.
  super__Head_base<0UL,_pbrt::PowerLightSampler_*,_false>._M_head_impl = (PowerLightSampler *)0x0;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  this_01._M_head_impl = (PowerLightSampler *)operator_new(0x68);
  pLVar1 = (lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lights_00.n = (long)(lights->
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pLVar1 >> 3;
  lights_00.ptr = pLVar1;
  PowerLightSampler::PowerLightSampler(this_01._M_head_impl,lights_00,alloc);
  local_68 = (PowerLightSampler *)0x0;
  __ptr_00._M_head_impl =
       (this_00->_M_t).
       super___uniq_ptr_impl<pbrt::PowerLightSampler,_std::default_delete<pbrt::PowerLightSampler>_>
       ._M_t.
       super__Tuple_impl<0UL,_pbrt::PowerLightSampler_*,_std::default_delete<pbrt::PowerLightSampler>_>
       .super__Head_base<0UL,_pbrt::PowerLightSampler_*,_false>._M_head_impl;
  (this_00->_M_t).
  super___uniq_ptr_impl<pbrt::PowerLightSampler,_std::default_delete<pbrt::PowerLightSampler>_>._M_t
  .super__Tuple_impl<0UL,_pbrt::PowerLightSampler_*,_std::default_delete<pbrt::PowerLightSampler>_>.
  super__Head_base<0UL,_pbrt::PowerLightSampler_*,_false>._M_head_impl = this_01._M_head_impl;
  if (__ptr_00._M_head_impl != (PowerLightSampler *)0x0) {
    std::default_delete<pbrt::PowerLightSampler>::operator()
              ((default_delete<pbrt::PowerLightSampler> *)this_00,__ptr_00._M_head_impl);
  }
  if (local_68 != (PowerLightSampler *)0x0) {
    std::default_delete<pbrt::PowerLightSampler>::operator()
              ((default_delete<pbrt::PowerLightSampler> *)&local_68,local_68);
  }
  return;
}

Assistant:

LightPathIntegrator::LightPathIntegrator(int maxDepth, CameraHandle camera,
                                         SamplerHandle sampler, PrimitiveHandle aggregate,
                                         std::vector<LightHandle> lights)
    : ImageTileIntegrator(camera, sampler, aggregate, lights), maxDepth(maxDepth) {
    lightSampler = std::make_unique<PowerLightSampler>(lights, Allocator());
}